

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::insert
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,CSkin *item,range r)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  CSkin *pCVar4;
  void *in_RSI;
  array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int index;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_38;
  int local_1c;
  plain_range<CSkins::CSkin> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = plain_range<CSkins::CSkin>::empty(&local_18);
  if (bVar2) {
    local_1c = add(in_RDI,(CSkin *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    pCVar4 = plain_range<CSkins::CSkin>::front((plain_range<CSkins::CSkin> *)in_RDI);
    iVar3 = (int)(((long)pCVar4 - (long)in_RDI->list) / 200);
    incsize(in_RDI);
    size(in_RDI);
    set_size(in_RDI,in_stack_ffffffffffffffbc);
    iVar1 = in_RDI->num_elements;
    while (local_38 = iVar1 + -1, iVar3 < local_38) {
      memcpy(in_RDI->list + local_38,in_RDI->list + (iVar1 + -2),200);
      iVar1 = local_38;
    }
    memcpy(in_RDI->list + iVar3,in_RSI,200);
    local_1c = in_RDI->num_elements + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}